

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::assessPivot(HEkkPrimal *this)

{
  reference pvVar1;
  reference pvVar2;
  long *in_RDI;
  HVector *unaff_retaddr;
  HighsInt in_stack_0000000c;
  bool quad_precision;
  HighsInt in_stack_00000034;
  HVector *in_stack_00000038;
  HVector *in_stack_00000040;
  bool in_stack_0000004f;
  HEkk *in_stack_00000050;
  HEkkPrimal *in_stack_00000070;
  
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f),
                      (long)*(int *)((long)in_RDI + 0x4c));
  in_RDI[0xe] = (long)*pvVar1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x2978),
                      (long)*(int *)((long)in_RDI + 0x4c));
  *(value_type *)(in_RDI + 10) = *pvVar2;
  HEkk::unitBtran((HEkk *)this,in_stack_0000000c,unaff_retaddr);
  HEkk::tableauRowPrice
            (in_stack_00000050,in_stack_0000004f,in_stack_00000040,in_stack_00000038,
             in_stack_00000034);
  updateVerify(in_stack_00000070);
  return;
}

Assistant:

void HEkkPrimal::assessPivot() {
  assert(row_out >= 0);
  // Record the pivot entry
  alpha_col = col_aq.array[row_out];
  variable_out = ekk_instance_.basis_.basicIndex_[row_out];

  // Compute the tableau row
  //
  // BTRAN
  //
  // Compute unit BTran for tableau row and FT update
  ekk_instance_.unitBtran(row_out, row_ep);
  //
  // PRICE
  //
  const bool quad_precision = false;
  ekk_instance_.tableauRowPrice(quad_precision, row_ep, row_ap);

  // Checks row-wise pivot against column-wise pivot for
  // numerical trouble
  //
  // rebuild_reason = kRebuildReasonPossiblySingularBasis is set if
  // numerical trouble is detected
  updateVerify();
}